

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O0

char * Io_WriteVerilogGetName(char *pName)

{
  int iVar1;
  size_t sVar2;
  int local_20;
  int i;
  int Length;
  char *pName_local;
  
  sVar2 = strlen(pName);
  iVar1 = (int)sVar2;
  if ((iVar1 != 1) || ((*pName != '0' && (*pName != '1')))) {
    for (local_20 = 0;
        (local_20 < iVar1 &&
        (((('`' < pName[local_20] && (pName[local_20] < '{')) ||
          (('@' < pName[local_20] && (pName[local_20] < '[')))) ||
         ((('/' < pName[local_20] && (pName[local_20] < ':')) || (pName[local_20] == '_'))))));
        local_20 = local_20 + 1) {
    }
    if (local_20 == iVar1) {
      return pName;
    }
  }
  Io_WriteVerilogGetName::Buffer[0] = '\\';
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    Io_WriteVerilogGetName::Buffer[local_20 + 1] = pName[local_20];
  }
  Io_WriteVerilogGetName::Buffer[iVar1 + 1] = ' ';
  Io_WriteVerilogGetName::Buffer[iVar1 + 2] = '\0';
  pName_local = Io_WriteVerilogGetName::Buffer;
  return pName_local;
}

Assistant:

char * Io_WriteVerilogGetName( char * pName )
{
    static char Buffer[500];
    int Length, i;
    Length = strlen(pName);
    // consider the case of a signal having name "0" or "1"
    if ( !(Length == 1 && (pName[0] == '0' || pName[0] == '1')) )
    {
        for ( i = 0; i < Length; i++ )
            if ( !((pName[i] >= 'a' && pName[i] <= 'z') || 
                 (pName[i] >= 'A' && pName[i] <= 'Z') || 
                 (pName[i] >= '0' && pName[i] <= '9') || pName[i] == '_') )
                 break;
        if ( i == Length )
            return pName;
    }
    // create Verilog style name
    Buffer[0] = '\\';
    for ( i = 0; i < Length; i++ )
        Buffer[i+1] = pName[i];
    Buffer[Length+1] = ' ';
    Buffer[Length+2] = 0;
    return Buffer;
}